

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomSlots::read(DomSlots *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView tag;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffee8;
  QStringBuilder<QLatin1String,_const_QStringView_&> *this_00;
  QLatin1String *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  byte in_stack_fffffffffffffeff;
  QStringView *in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff08;
  QStringBuilder<QLatin1String,_const_QStringView_&> *pQVar4;
  undefined1 local_98 [64];
  undefined1 local_58 [64];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QStringBuilder<QLatin1String,_const_QStringView_&> *)
            CONCAT44(in_register_00000034,__fd);
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x19f44a);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0019f68f;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_18._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT44(iVar2,in_stack_ffffffffffffff08),
                 (size_t)in_stack_ffffffffffffff00);
      QStringView::QStringView<QString,_true>
                (in_stack_ffffffffffffff00,
                 (QString *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      other.m_data = (storage_type_conflict *)this_00;
      other.m_size = (qsizetype)this;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffee8,other,CaseInsensitive);
      in_stack_ffffffffffffff08 = CONCAT13(iVar3 != 0,(int3)in_stack_ffffffffffffff08) ^ 0xff000000;
      QString::~QString((QString *)0x19f51c);
      if ((in_stack_ffffffffffffff08 & 0x1000000) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT44(iVar2,in_stack_ffffffffffffff08),
                   (size_t)in_stack_ffffffffffffff00);
        QStringView::QStringView<QString,_true>
                  (in_stack_ffffffffffffff00,
                   (QString *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
        other_00.m_data = (storage_type_conflict *)this_00;
        other_00.m_size = (qsizetype)this;
        iVar2 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffee8,other_00,CaseInsensitive);
        in_stack_fffffffffffffeff = iVar2 != 0 ^ 0xff;
        QString::~QString((QString *)0x19f5d2);
        if ((in_stack_fffffffffffffeff & 1) == 0) {
          pQVar4 = this_00;
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                     (size_t)in_stack_fffffffffffffef0);
          ::operator+(in_stack_fffffffffffffef0,(QStringView *)this_00);
          ::QStringBuilder::operator_cast_to_QString(this_00);
          QXmlStreamReader::raiseError((QString *)this_00);
          QString::~QString((QString *)0x19f684);
          in_stack_fffffffffffffee8 = this_00;
          this_00 = pQVar4;
        }
        else {
          in_stack_fffffffffffffef0 = (QLatin1String *)&this->m_slot;
          QXmlStreamReader::readElementText(local_98,this_00,0);
          QList<QString>::append
                    ((QList<QString> *)in_stack_fffffffffffffef0,
                     (rvalue_ref)in_stack_fffffffffffffee8);
          QString::~QString((QString *)0x19f61d);
        }
      }
      else {
        in_stack_ffffffffffffff00 = (QStringView *)&this->m_signal;
        QXmlStreamReader::readElementText(local_58,this_00,0);
        QList<QString>::append
                  ((QList<QString> *)in_stack_fffffffffffffef0,(rvalue_ref)in_stack_fffffffffffffee8
                  );
        QString::~QString((QString *)0x19f567);
      }
    }
  } while (iVar2 != 5);
LAB_0019f68f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomSlots::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"signal"_s, Qt::CaseInsensitive)) {
                m_signal.append(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"slot"_s, Qt::CaseInsensitive)) {
                m_slot.append(reader.readElementText());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}